

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

SQInteger __thiscall SQSharedState::ResurrectUnreachable(SQSharedState *this,SQVM *vm)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue SVar2;
  SQObjectValue SVar3;
  SQSharedState *pSVar4;
  SQObjectType SVar5;
  SQObjectValue this_00;
  SQObjectValue SVar6;
  SQCollectable_conflict *this_01;
  SQInteger SVar7;
  SQObject sqo;
  SQCollectable_conflict *tchain;
  SQObject local_50;
  SQVM *local_40;
  SQCollectable_conflict *local_38;
  
  local_38 = (SQCollectable_conflict *)0x0;
  RunMark(this,vm,&local_38);
  SVar2 = (SQObjectValue)this->_gc_chain;
  this->_gc_chain = local_38;
  if (SVar2.pTable == (SQTable *)0x0) {
    this_00.pTable = (SQTable *)0x0;
    SVar7 = 0;
  }
  else {
    local_40 = vm;
    this_00.pUserPointer = sq_vm_malloc(0x48);
    SVar7 = 0;
    SQArray::SQArray(this_00.pArray,this,0);
    SVar3 = SVar2;
    do {
      SVar6 = SVar3;
      SVar5 = (*((SVar6.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _vptr_SQRefCounted[3])(SVar6.pTable);
      if ((SVar5 != OT_FUNCPROTO) && (SVar5 != OT_OUTER)) {
        local_50._type = SVar5;
        local_50._unVal = SVar6;
        SQArray::Append(this_00.pArray,&local_50);
      }
      SVar3 = (SQObjectValue)((SVar6.pTable)->super_SQDelegable).super_SQCollectable._next;
      SVar7 = SVar7 + 1;
    } while (SVar3.pTable != (SQTable *)0x0);
    pSVar4 = (SQSharedState *)this->_gc_chain;
    (SVar6.pString)->_sharedstate = pSVar4;
    if (pSVar4 != (SQSharedState *)0x0) {
      pSVar4->_types = (SQObjectPtrVec *)SVar6;
    }
    this->_gc_chain = (SQCollectable_conflict *)SVar2;
    vm = local_40;
  }
  for (this_01 = this->_gc_chain; this_01 != (SQCollectable_conflict *)0x0;
      this_01 = (SQCollectable_conflict *)((SQCollectable *)this_01)->_next) {
    SQCollectable::UnMark((SQCollectable *)this_01);
  }
  if (this_00.pTable == (SQTable *)0x0) {
    SQVM::PushNull(vm);
  }
  else {
    local_50._type = OT_ARRAY;
    pSVar1 = &((this_00.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    local_50._unVal = this_00;
    SQVM::Push(vm,(SQObjectPtr *)&local_50);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_50);
  }
  return SVar7;
}

Assistant:

SQInteger SQSharedState::ResurrectUnreachable(SQVM *vm)
{
    SQInteger n=0;
    SQCollectable *tchain=NULL;

    RunMark(vm,&tchain);

    SQCollectable *resurrected = _gc_chain;
    SQCollectable *t = resurrected;

    _gc_chain = tchain;

    SQArray *ret = NULL;
    if(resurrected) {
        ret = SQArray::Create(this,0);
        SQCollectable *rlast = NULL;
        while(t) {
            rlast = t;
            SQObjectType type = t->GetType();
            if(type != OT_FUNCPROTO && type != OT_OUTER) {
                SQObject sqo;
                sqo._type = type;
                sqo._unVal.pRefCounted = t;
                ret->Append(sqo);
            }
            t = t->_next;
            n++;
        }

        assert(rlast->_next == NULL);
        rlast->_next = _gc_chain;
        if(_gc_chain)
        {
            _gc_chain->_prev = rlast;
        }
        _gc_chain = resurrected;
    }

    t = _gc_chain;
    while(t) {
        t->UnMark();
        t = t->_next;
    }

    if(ret) {
        SQObjectPtr temp = ret;
        vm->Push(temp);
    }
    else {
        vm->PushNull();
    }
    return n;
}